

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 extraout_RAX;
  int __oflag_00;
  Param param;
  Param *in_stack_fffffffffffffd60;
  Param *in_stack_fffffffffffffd90;
  char local_268 [176];
  Param *in_stack_fffffffffffffe48;
  byte local_1;
  
  Param::Param(in_stack_fffffffffffffd90);
  uVar2 = Param::open((Param *)local_268,(char *)((ulong)__file & 0xffffffff),__oflag,
                      (anonymous_namespace)::long_options);
  if (((uVar2 & 1) == 0) || (bVar1 = load_dictionary_resource(in_stack_fffffffffffffe48), !bVar1)) {
    in_stack_fffffffffffffd60 = (Param *)Param::what((Param *)0x14606e);
    setGlobalError((char *)0x14607f);
    local_1 = 0;
  }
  else {
    iVar3 = open(this,local_268,__oflag_00);
    local_1 = (byte)iVar3 & 1;
  }
  Param::~Param(in_stack_fffffffffffffd60);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1);
}

Assistant:

bool ModelImpl::open(int argc, char **argv) {
  Param param;
  if (!param.open(argc, argv, long_options) ||
      !load_dictionary_resource(&param)) {
    setGlobalError(param.what());
    return false;
  }
  return open(param);
}